

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O3

void __thiscall
btConeTwistConstraint::solveConstraintObsolete
          (btConeTwistConstraint *this,btSolverBody *bodyA,btSolverBody *bodyB,btScalar timeStep)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  btRigidBody *pbVar15;
  btRigidBody *pbVar16;
  btRigidBody *pbVar17;
  btRigidBody *pbVar18;
  long lVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  btScalar bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  btVector3 omegaB;
  btVector3 omegaA;
  btVector3 omegaADes;
  btVector3 omegaBDes;
  btTransform trBCur;
  btTransform trACur;
  btTransform trAPred;
  btTransform trBPred;
  float local_428;
  float fStack_424;
  float local_418;
  float fStack_414;
  float local_408;
  float fStack_404;
  float local_368;
  float fStack_364;
  btVector3 local_298;
  btVector3 local_288;
  float local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined1 local_268 [16];
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  btVector3 local_228;
  btVector3 local_218;
  btVector3 local_208;
  btTransform local_1f8;
  btTransform local_1b8;
  undefined1 local_170 [48];
  undefined1 local_140 [8];
  float fStack_138;
  btTransform local_130;
  btTransform local_f0;
  btMatrix3x3 local_b0;
  undefined8 local_80;
  undefined8 uStack_78;
  btTransform local_70;
  
  if (this->m_useSolveConstraintObsolete != true) {
    return;
  }
  pbVar15 = (this->super_btTypedConstraint).m_rbA;
  pbVar16 = (this->super_btTypedConstraint).m_rbB;
  if (this->m_angularOnly == false) {
    fVar50 = (this->m_rbBFrame).m_origin.m_floats[2];
    fVar41 = (this->m_rbBFrame).m_origin.m_floats[0];
    fVar51 = (this->m_rbBFrame).m_origin.m_floats[1];
    fVar45 = (pbVar16->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
    fVar44 = (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2] *
             fVar50 + (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                      [0] * fVar41 +
                      (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                      [1] * fVar51 + fVar45;
    fVar42 = (pbVar16->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0];
    fVar38 = (pbVar16->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1];
    fVar37 = (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] *
             fVar50 + (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                      [0] * fVar41 +
                      (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                      [1] * fVar51 + fVar38;
    fVar28 = fVar50 * (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                      [2] +
             fVar41 * (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                      [0] +
             fVar51 * (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                      [1] + fVar42;
    fVar50 = (this->m_rbAFrame).m_origin.m_floats[2];
    fVar41 = (this->m_rbAFrame).m_origin.m_floats[0];
    fVar51 = (this->m_rbAFrame).m_origin.m_floats[1];
    fVar47 = (pbVar15->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
    fVar53 = (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2] *
             fVar50 + (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                      [0] * fVar41 +
                      (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                      [1] * fVar51 + fVar47;
    fVar36 = (pbVar15->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0];
    fVar57 = (pbVar15->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1];
    fVar55 = (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] *
             fVar50 + (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                      [0] * fVar41 +
                      (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                      [1] * fVar51 + fVar57;
    fVar48 = fVar50 * (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                      [2] +
             fVar41 * (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                      [0] +
             fVar51 * (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                      [1] + fVar36;
    fVar36 = fVar48 - fVar36;
    fVar57 = fVar55 - fVar57;
    fVar47 = fVar53 - fVar47;
    fVar42 = fVar28 - fVar42;
    fVar50 = (bodyA->m_linearVelocity).m_floats[0];
    fVar41 = (bodyA->m_linearVelocity).m_floats[1];
    fVar51 = (bodyA->m_deltaLinearVelocity).m_floats[0];
    fVar35 = (bodyA->m_deltaLinearVelocity).m_floats[1];
    fVar38 = fVar37 - fVar38;
    fVar59 = (bodyA->m_linearVelocity).m_floats[2];
    fVar33 = (bodyA->m_deltaLinearVelocity).m_floats[2];
    fVar34 = (bodyA->m_angularVelocity).m_floats[1] + (bodyA->m_deltaAngularVelocity).m_floats[1];
    fVar49 = (bodyA->m_angularVelocity).m_floats[2] + (bodyA->m_deltaAngularVelocity).m_floats[2];
    fVar45 = fVar44 - fVar45;
    fVar54 = (bodyA->m_angularVelocity).m_floats[0] + (bodyA->m_deltaAngularVelocity).m_floats[0];
    fVar21 = (bodyB->m_angularVelocity).m_floats[1] + (bodyB->m_deltaAngularVelocity).m_floats[1];
    fVar25 = (bodyB->m_angularVelocity).m_floats[2] + (bodyB->m_deltaAngularVelocity).m_floats[2];
    fVar23 = (bodyB->m_linearVelocity).m_floats[0];
    fVar43 = (bodyB->m_deltaLinearVelocity).m_floats[0];
    fVar26 = (bodyB->m_angularVelocity).m_floats[0] + (bodyB->m_deltaAngularVelocity).m_floats[0];
    fVar52 = (bodyB->m_linearVelocity).m_floats[1];
    fVar27 = (bodyB->m_deltaLinearVelocity).m_floats[1];
    fVar40 = (bodyB->m_linearVelocity).m_floats[2];
    fVar31 = (bodyB->m_deltaLinearVelocity).m_floats[2];
    pbVar17 = bodyA->m_originalBody;
    pbVar18 = bodyB->m_originalBody;
    lVar19 = 0;
    do {
      fVar22 = 1.0 / *(float *)((long)(&this->m_jac[0].m_1MinvJt + 1) + lVar19);
      uVar11 = *(undefined8 *)((long)this->m_jac[0].m_linearJointAxis.m_floats + lVar19);
      fVar29 = (float)uVar11;
      fVar32 = (float)((ulong)uVar11 >> 0x20);
      fVar1 = *(float *)((long)this->m_jac[0].m_linearJointAxis.m_floats + lVar19 + 8);
      fVar22 = ((((fVar53 - fVar44) * fVar1 +
                 (fVar48 - fVar28) * fVar29 + (fVar55 - fVar37) * fVar32) * -0.3) / timeStep) *
               fVar22 - (fVar1 * (((fVar54 * fVar57 - fVar36 * fVar34) + fVar59 + fVar33) -
                                 ((fVar26 * fVar38 - fVar42 * fVar21) + fVar40 + fVar31)) +
                        fVar29 * (((fVar34 * fVar47 - fVar57 * fVar49) + fVar50 + fVar51) -
                                 ((fVar21 * fVar45 - fVar38 * fVar25) + fVar23 + fVar43)) +
                        (((fVar49 * fVar36 - fVar47 * fVar54) + fVar41 + fVar35) -
                        ((fVar25 * fVar42 - fVar45 * fVar26) + fVar52 + fVar27)) * fVar32) * fVar22;
      (this->super_btTypedConstraint).m_appliedImpulse =
           (this->super_btTypedConstraint).m_appliedImpulse + fVar22;
      if (pbVar17 != (btRigidBody *)0x0) {
        fVar56 = fVar36 * fVar32 + fVar29 * -fVar57;
        fVar58 = fVar57 * fVar1 + fVar32 * -fVar47;
        fVar46 = fVar1 * -fVar36 + fVar47 * fVar29;
        fVar2 = *(float *)&pbVar15->field_0x170;
        fVar3 = *(float *)&pbVar15->field_0x16c;
        fVar4 = *(float *)&pbVar15->field_0x174;
        fVar5 = pbVar15->m_inverseMass;
        fVar6 = (bodyA->m_linearFactor).m_floats[2];
        uVar11 = *(undefined8 *)(bodyA->m_deltaLinearVelocity).m_floats;
        uVar12 = *(undefined8 *)(bodyA->m_deltaAngularVelocity).m_floats;
        uVar13 = *(undefined8 *)(bodyA->m_angularFactor).m_floats;
        uVar14 = *(undefined8 *)(bodyA->m_linearFactor).m_floats;
        fVar7 = *(float *)&pbVar15->field_0x160;
        fVar8 = *(float *)&(pbVar15->super_btCollisionObject).field_0x14c;
        fVar9 = *(float *)&pbVar15->field_0x150;
        fVar10 = *(float *)&pbVar15->field_0x154;
        fVar30 = *(float *)&pbVar15->field_0x15c;
        fVar39 = *(float *)&pbVar15->field_0x164;
        *(ulong *)(bodyA->m_deltaLinearVelocity).m_floats =
             CONCAT44((float)((ulong)uVar14 >> 0x20) * fVar5 * fVar32 * fVar22 +
                      (float)((ulong)uVar11 >> 0x20),
                      (float)uVar14 * fVar5 * fVar29 * fVar22 + (float)uVar11);
        (bodyA->m_deltaLinearVelocity).m_floats[2] =
             fVar1 * fVar5 * fVar22 * fVar6 + (bodyA->m_deltaLinearVelocity).m_floats[2];
        fVar5 = (bodyA->m_angularFactor).m_floats[2];
        local_408 = (float)uVar12;
        fStack_404 = (float)((ulong)uVar12 >> 0x20);
        *(ulong *)(bodyA->m_deltaAngularVelocity).m_floats =
             CONCAT44((float)((ulong)uVar13 >> 0x20) * fVar22 *
                      (fVar56 * fVar39 + fVar58 * fVar30 + fVar46 * fVar7) + fStack_404,
                      (float)uVar13 * fVar22 * (fVar56 * fVar10 + fVar58 * fVar8 + fVar46 * fVar9) +
                      local_408);
        (bodyA->m_deltaAngularVelocity).m_floats[2] =
             fVar5 * fVar22 * (fVar4 * fVar56 + fVar3 * fVar58 + fVar2 * fVar46) +
             (bodyA->m_deltaAngularVelocity).m_floats[2];
      }
      if (pbVar18 != (btRigidBody *)0x0) {
        fVar46 = fVar38 * fVar1 + fVar32 * -fVar45;
        fVar39 = fVar45 * fVar29 + fVar1 * -fVar42;
        fVar30 = fVar29 * -fVar38 + fVar42 * fVar32;
        fVar1 = *(float *)&pbVar16->field_0x170;
        fVar29 = *(float *)&pbVar16->field_0x16c;
        fVar32 = *(float *)&pbVar16->field_0x174;
        fVar2 = pbVar16->m_inverseMass;
        fVar3 = *(float *)((long)this->m_jac[0].m_linearJointAxis.m_floats + lVar19 + 8);
        uVar11 = *(undefined8 *)((long)this->m_jac[0].m_linearJointAxis.m_floats + lVar19);
        uVar12 = *(undefined8 *)(bodyB->m_linearFactor).m_floats;
        uVar13 = *(undefined8 *)(bodyB->m_deltaLinearVelocity).m_floats;
        fVar4 = *(float *)&pbVar16->field_0x160;
        fVar5 = *(float *)&(pbVar16->super_btCollisionObject).field_0x14c;
        fVar6 = *(float *)&pbVar16->field_0x150;
        fVar7 = *(float *)&pbVar16->field_0x154;
        fVar8 = *(float *)&pbVar16->field_0x15c;
        fVar9 = *(float *)&pbVar16->field_0x164;
        fVar10 = (bodyB->m_linearFactor).m_floats[2];
        *(ulong *)(bodyB->m_deltaLinearVelocity).m_floats =
             CONCAT44((float)((ulong)uVar13 >> 0x20) -
                      (float)((ulong)uVar12 >> 0x20) *
                      fVar2 * (float)((ulong)uVar11 >> 0x20) * fVar22,
                      (float)uVar13 - (float)uVar12 * fVar2 * (float)uVar11 * fVar22);
        (bodyB->m_deltaLinearVelocity).m_floats[2] =
             (bodyB->m_deltaLinearVelocity).m_floats[2] - fVar3 * fVar2 * fVar22 * fVar10;
        fVar2 = (bodyB->m_angularFactor).m_floats[2];
        uVar11 = *(undefined8 *)(bodyB->m_angularFactor).m_floats;
        uVar12 = *(undefined8 *)(bodyB->m_deltaAngularVelocity).m_floats;
        *(ulong *)(bodyB->m_deltaAngularVelocity).m_floats =
             CONCAT44((float)((ulong)uVar12 >> 0x20) -
                      (float)((ulong)uVar11 >> 0x20) * fVar22 *
                      (fVar30 * fVar9 + fVar46 * fVar8 + fVar39 * fVar4),
                      (float)uVar12 -
                      (float)uVar11 * fVar22 * (fVar30 * fVar7 + fVar46 * fVar5 + fVar39 * fVar6));
        (bodyB->m_deltaAngularVelocity).m_floats[2] =
             (bodyB->m_deltaAngularVelocity).m_floats[2] -
             fVar22 * fVar2 * (fVar32 * fVar30 + fVar29 * fVar46 + fVar1 * fVar39);
      }
      lVar19 = lVar19 + 0x54;
    } while (lVar19 != 0xfc);
  }
  if (this->m_bMotorEnabled == true) {
    local_1b8.m_basis.m_el[0].m_floats._0_8_ =
         *(undefined8 *)(pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
    ;
    local_1b8.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)
          ((pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats + 2);
    local_1b8.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
    ;
    local_1b8.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)
          ((pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats + 2);
    local_1b8.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
    ;
    local_1b8.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)
          ((pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 2);
    local_1b8.m_origin.m_floats._0_8_ =
         *(undefined8 *)(pbVar15->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
    local_1b8.m_origin.m_floats._8_8_ =
         *(undefined8 *)((pbVar15->super_btCollisionObject).m_worldTransform.m_origin.m_floats + 2);
    local_1f8.m_basis.m_el[0].m_floats._0_8_ =
         *(undefined8 *)(pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
    ;
    local_1f8.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)
          ((pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats + 2);
    local_1f8.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
    ;
    local_1f8.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)
          ((pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats + 2);
    local_1f8.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
    ;
    local_1f8.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)
          ((pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 2);
    local_1f8.m_origin.m_floats._0_8_ =
         *(undefined8 *)(pbVar16->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
    local_1f8.m_origin.m_floats._8_8_ =
         *(undefined8 *)((pbVar16->super_btCollisionObject).m_worldTransform.m_origin.m_floats + 2);
    uVar11 = *(undefined8 *)(bodyA->m_deltaAngularVelocity).m_floats;
    uVar12 = *(undefined8 *)(bodyA->m_angularVelocity).m_floats;
    local_228.m_floats[0] = (float)uVar12 + (float)uVar11;
    local_228.m_floats[1] = (float)((ulong)uVar12 >> 0x20) + (float)((ulong)uVar11 >> 0x20);
    local_228.m_floats[2] =
         (bodyA->m_angularVelocity).m_floats[2] + (bodyA->m_deltaAngularVelocity).m_floats[2];
    local_228.m_floats[3] = 0.0;
    uVar11 = *(undefined8 *)(bodyB->m_deltaAngularVelocity).m_floats;
    uVar12 = *(undefined8 *)(bodyB->m_angularVelocity).m_floats;
    local_288.m_floats[0] = (float)uVar12 + (float)uVar11;
    local_288.m_floats[1] = (float)((ulong)uVar12 >> 0x20) + (float)((ulong)uVar11 >> 0x20);
    local_288.m_floats[2] =
         (bodyB->m_angularVelocity).m_floats[2] + (bodyB->m_deltaAngularVelocity).m_floats[2];
    local_288.m_floats[3] = 0.0;
    local_130.m_basis.m_el[0].m_floats[0] = 1.0;
    local_130.m_basis.m_el[0].m_floats[1] = 0.0;
    local_130.m_basis.m_el[0].m_floats[2] = 0.0;
    local_130.m_basis.m_el[0].m_floats[3] = 0.0;
    local_130.m_basis.m_el[1].m_floats[0] = 0.0;
    local_130.m_basis.m_el[1].m_floats[1] = 1.0;
    local_130.m_basis.m_el[1].m_floats[2] = 0.0;
    local_130.m_basis.m_el[1].m_floats[3] = 0.0;
    local_130.m_basis.m_el[2].m_floats[0] = 0.0;
    local_130.m_basis.m_el[2].m_floats[1] = 0.0;
    local_130.m_basis.m_el[2].m_floats[2] = 1.0;
    local_130.m_basis.m_el[2].m_floats[3] = 0.0;
    local_130.m_origin.m_floats[0] = 0.0;
    local_130.m_origin.m_floats[1] = 0.0;
    local_130.m_origin.m_floats[2] = 0.0;
    local_130.m_origin.m_floats[3] = 0.0;
    local_298.m_floats[0] = 0.0;
    local_298.m_floats[1] = 0.0;
    local_298.m_floats[2] = 0.0;
    local_298.m_floats[3] = 0.0;
    btTransformUtil::integrateTransform(&local_1b8,&local_298,&local_228,timeStep,&local_130);
    local_70.m_basis.m_el[0].m_floats[0] = 1.0;
    local_70.m_basis.m_el[0].m_floats[1] = 0.0;
    local_70.m_basis.m_el[0].m_floats[2] = 0.0;
    local_70.m_basis.m_el[0].m_floats[3] = 0.0;
    local_70.m_basis.m_el[1].m_floats[0] = 0.0;
    local_70.m_basis.m_el[1].m_floats[1] = 1.0;
    local_70.m_basis.m_el[1].m_floats[2] = 0.0;
    local_70.m_basis.m_el[1].m_floats[3] = 0.0;
    local_70.m_basis.m_el[2].m_floats[0] = 0.0;
    local_70.m_basis.m_el[2].m_floats[1] = 0.0;
    local_70.m_basis.m_el[2].m_floats[2] = 1.0;
    local_70.m_basis.m_el[2].m_floats[3] = 0.0;
    local_70.m_origin.m_floats[0] = 0.0;
    local_70.m_origin.m_floats[1] = 0.0;
    local_70.m_origin.m_floats[2] = 0.0;
    local_70.m_origin.m_floats[3] = 0.0;
    btTransformUtil::integrateTransform(&local_1f8,&local_298,&local_288,timeStep,&local_70);
    btMatrix3x3::setRotation(&local_b0,&this->m_qTarget);
    local_80 = 0;
    uStack_78 = 0;
    fVar50 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[0];
    fVar41 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[1];
    fVar51 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[2];
    fVar21 = local_b0.m_el[2].m_floats[0] * fVar51 +
             local_b0.m_el[0].m_floats[0] * fVar50 + local_b0.m_el[1].m_floats[0] * fVar41;
    fVar40 = local_b0.m_el[2].m_floats[1] * fVar51 +
             local_b0.m_el[0].m_floats[1] * fVar50 + local_b0.m_el[1].m_floats[1] * fVar41;
    fVar27 = local_b0.m_el[2].m_floats[2] * fVar51 +
             local_b0.m_el[0].m_floats[2] * fVar50 + local_b0.m_el[1].m_floats[2] * fVar41;
    fVar45 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[1];
    fVar42 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[0];
    fVar38 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[2];
    fVar47 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[1];
    fVar36 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[0];
    fVar57 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[2];
    fVar35 = (this->m_rbBFrame).m_origin.m_floats[0];
    fVar59 = (this->m_rbBFrame).m_origin.m_floats[1];
    fVar33 = (this->m_rbBFrame).m_origin.m_floats[2];
    _local_140 = stack0xfffffffffffffec4;
    btTransform::inverse(&this->m_rbAFrame);
    fVar23 = (float)local_170._40_4_ * fVar27 +
             (float)local_170._8_4_ * fVar21 + fVar40 * (float)local_170._24_4_;
    fVar28 = fStack_138 * fVar27 + (float)local_140._0_4_ * fVar21 + fVar40 * (float)local_140._4_4_
             + fVar51 * 0.0 + fVar50 * 0.0 + fVar41 * 0.0 + fVar33;
    fVar50 = (float)local_170._16_8_;
    fVar33 = SUB84(local_170._16_8_,4);
    fVar41 = (float)local_170._0_8_;
    fVar43 = SUB84(local_170._0_8_,4);
    fVar51 = (float)local_170._32_8_;
    fVar52 = SUB84(local_170._32_8_,4);
    fVar31 = fVar27 * fVar51 + fVar21 * fVar41 + fVar40 * fVar50;
    fVar21 = fVar27 * fVar52 + fVar21 * fVar43 + fVar40 * fVar33;
    fVar27 = local_b0.m_el[2].m_floats[0] * fVar38 +
             local_b0.m_el[0].m_floats[0] * fVar42 + local_b0.m_el[1].m_floats[0] * fVar45;
    fVar40 = local_b0.m_el[2].m_floats[0] * fVar57 +
             local_b0.m_el[0].m_floats[0] * fVar36 + local_b0.m_el[1].m_floats[0] * fVar47;
    fVar25 = local_b0.m_el[2].m_floats[1] * fVar38 +
             local_b0.m_el[0].m_floats[1] * fVar42 + local_b0.m_el[1].m_floats[1] * fVar45;
    fVar26 = local_b0.m_el[2].m_floats[1] * fVar57 +
             local_b0.m_el[0].m_floats[1] * fVar36 + local_b0.m_el[1].m_floats[1] * fVar47;
    fVar34 = local_b0.m_el[2].m_floats[2] * fVar38 +
             local_b0.m_el[0].m_floats[2] * fVar42 + local_b0.m_el[1].m_floats[2] * fVar45;
    fVar37 = local_b0.m_el[2].m_floats[2] * fVar57 +
             local_b0.m_el[0].m_floats[2] * fVar36 + local_b0.m_el[1].m_floats[2] * fVar47;
    local_248 = fStack_138 * fVar34 +
                (float)local_140._0_4_ * fVar27 + fVar25 * (float)local_140._4_4_ +
                fVar38 * 0.0 + fVar42 * 0.0 + fVar45 * 0.0 + fVar35;
    fVar45 = fStack_138 * fVar37 + (float)local_140._0_4_ * fVar40 + (float)local_140._4_4_ * fVar26
             + fVar57 * 0.0 + fVar36 * 0.0 + fVar47 * 0.0 + fVar59;
    local_f0.m_basis.m_el[0].m_floats[2] =
         fVar23 * local_130.m_basis.m_el[0].m_floats[2] +
         fVar31 * local_130.m_basis.m_el[0].m_floats[0] +
         fVar21 * local_130.m_basis.m_el[0].m_floats[1];
    local_f0.m_basis.m_el[1].m_floats[2] =
         fVar23 * local_130.m_basis.m_el[1].m_floats[2] +
         fVar31 * local_130.m_basis.m_el[1].m_floats[0] +
         fVar21 * local_130.m_basis.m_el[1].m_floats[1];
    local_f0.m_basis.m_el[2].m_floats[2] =
         fVar23 * local_130.m_basis.m_el[2].m_floats[2] +
         fVar31 * local_130.m_basis.m_el[2].m_floats[0] +
         fVar21 * local_130.m_basis.m_el[2].m_floats[1];
    fVar42 = (float)local_170._40_4_ * fVar34 +
             (float)local_170._8_4_ * fVar27 + (float)local_170._24_4_ * fVar25;
    fVar38 = (float)local_170._40_4_ * fVar37 +
             (float)local_170._8_4_ * fVar40 + (float)local_170._24_4_ * fVar26;
    fVar59 = fVar34 * fVar51 + fVar27 * fVar41 + fVar25 * fVar50;
    fStack_254 = fVar34 * fVar52 + fVar27 * fVar43 + fVar25 * fVar33;
    fStack_230 = fVar34 * 0.0 + fVar27 * 0.0 + fVar25 * 0.0;
    fStack_22c = fVar34 * 0.0 + fVar27 * 0.0 + fVar25 * 0.0;
    fVar47 = fVar37 * fVar51 + fVar40 * fVar41 + fVar26 * fVar50;
    fVar36 = fVar37 * fVar52 + fVar40 * fVar43 + fVar26 * fVar33;
    local_170._8_4_ =
         fVar23 * local_70.m_basis.m_el[0].m_floats[2] +
         fVar42 * local_70.m_basis.m_el[0].m_floats[0] +
         fVar38 * local_70.m_basis.m_el[0].m_floats[1];
    uStack_244 = 0;
    uStack_240 = 0;
    uStack_23c = 0;
    fVar50 = -local_248;
    local_238 = fVar59 * fVar50;
    local_258 = fStack_254 * fVar50;
    local_268 = ZEXT416((uint)fVar28);
    fVar51 = (fVar50 * fVar42 - fVar38 * fVar45) - fVar28 * fVar23;
    local_278 = local_70.m_basis.m_el[2].m_floats[0];
    uStack_274 = 0;
    uStack_270 = 0;
    uStack_26c = 0;
    local_170._24_4_ =
         fVar23 * local_70.m_basis.m_el[1].m_floats[2] +
         fVar42 * local_70.m_basis.m_el[1].m_floats[0] +
         fVar38 * local_70.m_basis.m_el[1].m_floats[1];
    local_170._40_4_ =
         local_70.m_basis.m_el[2].m_floats[2] * fVar23 +
         local_70.m_basis.m_el[2].m_floats[0] * fVar42 +
         local_70.m_basis.m_el[2].m_floats[1] * fVar38;
    local_140._0_4_ =
         local_70.m_basis.m_el[0].m_floats[2] * fVar28 +
         local_70.m_basis.m_el[0].m_floats[0] * local_248 +
         local_70.m_basis.m_el[0].m_floats[1] * fVar45 + local_70.m_origin.m_floats[0];
    local_140._4_4_ =
         local_70.m_basis.m_el[1].m_floats[2] * fVar28 +
         local_70.m_basis.m_el[1].m_floats[0] * local_248 +
         local_70.m_basis.m_el[1].m_floats[1] * fVar45 + local_70.m_origin.m_floats[1];
    fStack_138 = fVar28 * local_70.m_basis.m_el[2].m_floats[2] +
                 local_248 * local_70.m_basis.m_el[2].m_floats[0] +
                 fVar45 * local_70.m_basis.m_el[2].m_floats[1] + local_70.m_origin.m_floats[2];
    register0x0000124c = 0.0;
    fVar41 = (local_238 - fVar47 * fVar45) - fVar31 * fVar28;
    fVar50 = (local_258 - fVar36 * fVar45) - fVar21 * fVar28;
    local_170._12_4_ = 0.0;
    local_170._28_4_ = 0.0;
    local_170._44_4_ = 0.0;
    local_170._0_4_ =
         local_70.m_basis.m_el[0].m_floats[2] * fVar31 +
         local_70.m_basis.m_el[0].m_floats[0] * fVar59 +
         local_70.m_basis.m_el[0].m_floats[1] * fVar47;
    local_170._4_4_ =
         local_70.m_basis.m_el[0].m_floats[2] * fVar21 +
         local_70.m_basis.m_el[0].m_floats[0] * fStack_254 +
         local_70.m_basis.m_el[0].m_floats[1] * fVar36;
    local_170._20_4_ =
         local_70.m_basis.m_el[1].m_floats[2] * fVar21 +
         local_70.m_basis.m_el[1].m_floats[0] * fStack_254 +
         local_70.m_basis.m_el[1].m_floats[1] * fVar36;
    local_170._16_4_ =
         local_70.m_basis.m_el[1].m_floats[2] * fVar31 +
         local_70.m_basis.m_el[1].m_floats[0] * fVar59 +
         local_70.m_basis.m_el[1].m_floats[1] * fVar47;
    local_170._36_4_ =
         local_70.m_basis.m_el[2].m_floats[2] * fVar21 +
         local_70.m_basis.m_el[2].m_floats[0] * fStack_254 +
         local_70.m_basis.m_el[2].m_floats[1] * fVar36;
    local_170._32_4_ =
         local_70.m_basis.m_el[2].m_floats[2] * fVar31 +
         local_70.m_basis.m_el[2].m_floats[0] * fVar59 +
         local_70.m_basis.m_el[2].m_floats[1] * fVar47;
    fVar35 = local_130.m_basis.m_el[0].m_floats[2] * fVar42 +
             local_130.m_basis.m_el[0].m_floats[0] * fVar59 +
             local_130.m_basis.m_el[0].m_floats[1] * fStack_254;
    fVar57 = local_130.m_basis.m_el[0].m_floats[2] * fVar38 +
             local_130.m_basis.m_el[0].m_floats[0] * fVar47 +
             local_130.m_basis.m_el[0].m_floats[1] * fVar36;
    local_f0.m_origin.m_floats[0] =
         local_130.m_basis.m_el[0].m_floats[2] * fVar51 +
         local_130.m_basis.m_el[0].m_floats[0] * fVar41 +
         local_130.m_basis.m_el[0].m_floats[1] * fVar50 + local_130.m_origin.m_floats[0];
    local_f0.m_origin.m_floats[1] =
         local_130.m_basis.m_el[1].m_floats[2] * fVar51 +
         local_130.m_basis.m_el[1].m_floats[0] * fVar41 +
         local_130.m_basis.m_el[1].m_floats[1] * fVar50 + local_130.m_origin.m_floats[1];
    local_f0.m_origin.m_floats[2] =
         fVar51 * local_130.m_basis.m_el[2].m_floats[2] +
         fVar41 * local_130.m_basis.m_el[2].m_floats[0] +
         fVar50 * local_130.m_basis.m_el[2].m_floats[1] + local_130.m_origin.m_floats[2];
    local_f0.m_origin.m_floats[3] = 0.0;
    local_f0.m_basis.m_el[0].m_floats[1] = fVar57;
    local_f0.m_basis.m_el[0].m_floats[0] = fVar35;
    local_f0.m_basis.m_el[0].m_floats[3] = 0.0;
    local_f0.m_basis.m_el[1].m_floats[1] =
         local_130.m_basis.m_el[1].m_floats[2] * fVar38 +
         local_130.m_basis.m_el[1].m_floats[0] * fVar47 +
         local_130.m_basis.m_el[1].m_floats[1] * fVar36;
    local_f0.m_basis.m_el[1].m_floats[0] =
         local_130.m_basis.m_el[1].m_floats[2] * fVar42 +
         local_130.m_basis.m_el[1].m_floats[0] * fVar59 +
         local_130.m_basis.m_el[1].m_floats[1] * fStack_254;
    local_f0.m_basis.m_el[1].m_floats[3] = 0.0;
    local_f0.m_basis.m_el[2].m_floats[1] =
         local_130.m_basis.m_el[2].m_floats[2] * fVar38 +
         local_130.m_basis.m_el[2].m_floats[0] * fVar47 +
         local_130.m_basis.m_el[2].m_floats[1] * fVar36;
    local_f0.m_basis.m_el[2].m_floats[0] =
         local_130.m_basis.m_el[2].m_floats[2] * fVar42 +
         local_130.m_basis.m_el[2].m_floats[0] * fVar59 +
         local_130.m_basis.m_el[2].m_floats[1] * fStack_254;
    local_f0.m_basis.m_el[2].m_floats[3] = 0.0;
    fStack_250 = fStack_254;
    fStack_24c = fStack_254;
    fStack_234 = fStack_254;
    btTransformUtil::calculateVelocity
              (&local_1b8,(btTransform *)local_170,timeStep,&local_298,&local_218);
    btTransformUtil::calculateVelocity(&local_1f8,&local_f0,timeStep,&local_298,&local_208);
    fVar36 = 0.0;
    fVar51 = local_218.m_floats[0] - local_228.m_floats[0];
    fVar45 = local_218.m_floats[1] - local_228.m_floats[1];
    fVar42 = local_208.m_floats[0] - local_288.m_floats[0];
    fVar38 = local_208.m_floats[1] - local_288.m_floats[1];
    fVar50 = local_218.m_floats[2] - local_228.m_floats[2];
    fVar41 = local_208.m_floats[2] - local_288.m_floats[2];
    fVar47 = fVar50 * fVar50 + fVar51 * fVar51 + fVar45 * fVar45;
    fVar59 = 0.0;
    if (1.1920929e-07 < fVar47) {
      fVar57 = 1.0 / SQRT(fVar47);
      fVar36 = fVar50 * fVar57;
      fVar35 = fVar57 * fVar51;
      fVar57 = fVar57 * fVar45;
      pbVar15 = (this->super_btTypedConstraint).m_rbA;
      fVar59 = (*(float *)&pbVar15->field_0x174 * fVar36 +
               *(float *)&pbVar15->field_0x154 * fVar35 + *(float *)&pbVar15->field_0x164 * fVar57)
               * fVar36 +
               (*(float *)&pbVar15->field_0x16c * fVar36 +
               *(float *)&(pbVar15->super_btCollisionObject).field_0x14c * fVar35 +
               *(float *)&pbVar15->field_0x15c * fVar57) * fVar35 +
               (*(float *)&pbVar15->field_0x170 * fVar36 +
               *(float *)&pbVar15->field_0x150 * fVar35 + *(float *)&pbVar15->field_0x160 * fVar57)
               * fVar57;
    }
    fVar33 = fVar38 * fVar38;
    fVar23 = fVar42 * fVar42 + fVar33;
    fVar43 = fVar41 * fVar41 + fVar23;
    fVar52 = 0.0;
    fVar47 = fVar33;
    if (1.1920929e-07 < fVar43) {
      fVar47 = 1.0 / SQRT(fVar43);
      fVar23 = fVar41 * fVar47;
      fVar33 = fVar47 * fVar42;
      fVar47 = fVar47 * fVar38;
      pbVar15 = (this->super_btTypedConstraint).m_rbB;
      fVar52 = (*(float *)&pbVar15->field_0x174 * fVar23 +
               *(float *)&pbVar15->field_0x154 * fVar33 + *(float *)&pbVar15->field_0x164 * fVar47)
               * fVar23 +
               (*(float *)&pbVar15->field_0x16c * fVar23 +
               *(float *)&(pbVar15->super_btCollisionObject).field_0x14c * fVar33 +
               *(float *)&pbVar15->field_0x15c * fVar47) * fVar33 +
               (*(float *)&pbVar15->field_0x170 * fVar23 +
               *(float *)&pbVar15->field_0x150 * fVar33 + *(float *)&pbVar15->field_0x160 * fVar47)
               * fVar47;
    }
    fVar35 = fVar52 * fVar33 + fVar59 * fVar35;
    fVar47 = fVar47 * fVar52 + fVar57 * fVar59;
    fVar36 = fVar23 * fVar52 + fVar36 * fVar59;
    fVar57 = fVar36 * fVar36 + fVar35 * fVar35 + fVar47 * fVar47;
    if (fVar57 <= 1.1920929e-07) goto LAB_0018ad7c;
    fVar57 = 1.0 / SQRT(fVar57);
    fVar35 = fVar35 * fVar57;
    fVar47 = fVar47 * fVar57;
    fVar36 = fVar36 * fVar57;
    pbVar15 = (this->super_btTypedConstraint).m_rbA;
    pbVar16 = (this->super_btTypedConstraint).m_rbB;
    fVar57 = (*(float *)&pbVar15->field_0x174 * fVar36 +
             *(float *)&pbVar15->field_0x154 * fVar35 + *(float *)&pbVar15->field_0x164 * fVar47) *
             fVar36 + (*(float *)&pbVar15->field_0x16c * fVar36 +
                      *(float *)&(pbVar15->super_btCollisionObject).field_0x14c * fVar35 +
                      *(float *)&pbVar15->field_0x15c * fVar47) * fVar35 +
                      (*(float *)&pbVar15->field_0x170 * fVar36 +
                      *(float *)&pbVar15->field_0x150 * fVar35 +
                      *(float *)&pbVar15->field_0x160 * fVar47) * fVar47;
    fVar36 = (*(float *)&pbVar16->field_0x174 * fVar36 +
             *(float *)&pbVar16->field_0x154 * fVar35 + *(float *)&pbVar16->field_0x164 * fVar47) *
             fVar36 + (*(float *)&pbVar16->field_0x16c * fVar36 +
                      *(float *)&(pbVar16->super_btCollisionObject).field_0x14c * fVar35 +
                      *(float *)&pbVar16->field_0x15c * fVar47) * fVar35 +
                      (*(float *)&pbVar16->field_0x170 * fVar36 +
                      *(float *)&pbVar16->field_0x150 * fVar35 +
                      *(float *)&pbVar16->field_0x160 * fVar47) * fVar47;
    fVar47 = 1.0 / ((fVar36 + fVar57) * (fVar36 + fVar57));
    fVar50 = (fVar50 * fVar57 - fVar41 * fVar36) * fVar47;
    fVar41 = fVar47 * (fVar51 * fVar57 - fVar42 * fVar36);
    fVar47 = fVar47 * (fVar45 * fVar57 - fVar38 * fVar36);
    if (0.0 <= this->m_maxMotorImpulse) {
      if (this->m_bNormalizedMotorStrength == false) {
        fVar57 = 1.0;
      }
      fVar57 = this->m_maxMotorImpulse / fVar57;
      uVar11 = *(undefined8 *)(this->m_accMotorImpulse).m_floats;
      fVar42 = (float)uVar11;
      fVar38 = (float)((ulong)uVar11 >> 0x20);
      fVar35 = fVar41 + fVar42;
      fVar59 = fVar47 + fVar38;
      fVar51 = (this->m_accMotorImpulse).m_floats[2];
      fVar36 = fVar50 + fVar51;
      fVar45 = SQRT(fVar36 * fVar36 + fVar35 * fVar35 + fVar59 * fVar59);
      if (fVar57 < fVar45) {
        fVar45 = 1.0 / fVar45;
        fVar41 = fVar57 * fVar35 * fVar45 - fVar42;
        fVar47 = fVar57 * fVar59 * fVar45 - fVar38;
        fVar50 = fVar36 * fVar45 * fVar57 - fVar51;
      }
      *(ulong *)(this->m_accMotorImpulse).m_floats = CONCAT44(fVar38 + fVar47,fVar42 + fVar41);
      (this->m_accMotorImpulse).m_floats[2] = fVar51 + fVar50;
    }
    fVar51 = SQRT(fVar50 * fVar50 + fVar41 * fVar41 + fVar47 * fVar47);
    fVar45 = 1.0 / fVar51;
    fVar41 = fVar41 * fVar45;
    fVar47 = fVar47 * fVar45;
    fVar45 = fVar45 * fVar50;
    if (bodyA->m_originalBody != (btRigidBody *)0x0) {
      fVar50 = *(float *)&pbVar15->field_0x170;
      fVar42 = *(float *)&pbVar15->field_0x16c;
      fVar38 = *(float *)&pbVar15->field_0x174;
      fVar52 = fVar51 * 0.0;
      fVar36 = (bodyA->m_linearFactor).m_floats[2];
      uVar11 = *(undefined8 *)(bodyA->m_deltaLinearVelocity).m_floats;
      uVar12 = *(undefined8 *)(bodyA->m_deltaAngularVelocity).m_floats;
      uVar13 = *(undefined8 *)(bodyA->m_angularFactor).m_floats;
      uVar14 = *(undefined8 *)(bodyA->m_linearFactor).m_floats;
      fVar57 = *(float *)&pbVar15->field_0x160;
      fVar35 = *(float *)&(pbVar15->super_btCollisionObject).field_0x14c;
      fVar59 = *(float *)&pbVar15->field_0x150;
      fVar33 = *(float *)&pbVar15->field_0x154;
      fVar23 = *(float *)&pbVar15->field_0x15c;
      fVar43 = *(float *)&pbVar15->field_0x164;
      *(ulong *)(bodyA->m_deltaLinearVelocity).m_floats =
           CONCAT44(fVar52 * (float)((ulong)uVar14 >> 0x20) + (float)((ulong)uVar11 >> 0x20),
                    fVar52 * (float)uVar14 + (float)uVar11);
      (bodyA->m_deltaLinearVelocity).m_floats[2] =
           fVar36 * fVar52 + (bodyA->m_deltaLinearVelocity).m_floats[2];
      fVar36 = (bodyA->m_angularFactor).m_floats[2];
      *(ulong *)(bodyA->m_deltaAngularVelocity).m_floats =
           CONCAT44(fVar51 * (float)((ulong)uVar13 >> 0x20) *
                    (fVar45 * fVar43 + fVar41 * fVar23 + fVar47 * fVar57) +
                    (float)((ulong)uVar12 >> 0x20),
                    fVar51 * (float)uVar13 * (fVar45 * fVar33 + fVar41 * fVar35 + fVar47 * fVar59) +
                    (float)uVar12);
      (bodyA->m_deltaAngularVelocity).m_floats[2] =
           fVar36 * fVar51 * (fVar38 * fVar45 + fVar42 * fVar41 + fVar50 * fVar47) +
           (bodyA->m_deltaAngularVelocity).m_floats[2];
    }
    if (bodyB->m_originalBody == (btRigidBody *)0x0) goto LAB_0018ad7c;
    fVar50 = *(float *)&pbVar16->field_0x170;
    fVar42 = *(float *)&pbVar16->field_0x16c;
    fVar38 = *(float *)&pbVar16->field_0x174;
    fVar52 = fVar51 * -0.0;
    fVar36 = (bodyB->m_linearFactor).m_floats[2];
    uVar11 = *(undefined8 *)(bodyB->m_deltaLinearVelocity).m_floats;
    uVar12 = *(undefined8 *)(bodyB->m_deltaAngularVelocity).m_floats;
    uVar13 = *(undefined8 *)(bodyB->m_angularFactor).m_floats;
    uVar14 = *(undefined8 *)(bodyB->m_linearFactor).m_floats;
    fVar57 = *(float *)&pbVar16->field_0x160;
    fVar35 = *(float *)&(pbVar16->super_btCollisionObject).field_0x14c;
    fVar59 = *(float *)&pbVar16->field_0x150;
    fVar33 = *(float *)&pbVar16->field_0x154;
    fVar23 = *(float *)&pbVar16->field_0x15c;
    fVar43 = *(float *)&pbVar16->field_0x164;
    *(ulong *)(bodyB->m_deltaLinearVelocity).m_floats =
         CONCAT44(fVar52 * (float)((ulong)uVar14 >> 0x20) + (float)((ulong)uVar11 >> 0x20),
                  fVar52 * (float)uVar14 + (float)uVar11);
    (bodyB->m_deltaLinearVelocity).m_floats[2] =
         fVar36 * fVar52 + (bodyB->m_deltaLinearVelocity).m_floats[2];
    fVar36 = (bodyB->m_angularFactor).m_floats[2];
    *(ulong *)(bodyB->m_deltaAngularVelocity).m_floats =
         CONCAT44((float)((ulong)uVar12 >> 0x20) -
                  fVar51 * (float)((ulong)uVar13 >> 0x20) *
                  (fVar45 * fVar43 + fVar41 * fVar23 + fVar47 * fVar57),
                  (float)uVar12 -
                  fVar51 * (float)uVar13 * (fVar45 * fVar33 + fVar41 * fVar35 + fVar47 * fVar59));
    bVar24 = (bodyB->m_deltaAngularVelocity).m_floats[2] -
             fVar36 * fVar51 * (fVar38 * fVar45 + fVar42 * fVar41 + fVar50 * fVar47);
  }
  else {
    if (this->m_damping <= 1.1920929e-07) goto LAB_0018ad7c;
    uVar11 = *(undefined8 *)(bodyA->m_deltaAngularVelocity).m_floats;
    fVar42 = (float)uVar11;
    fVar38 = (float)((ulong)uVar11 >> 0x20);
    fVar50 = (bodyA->m_deltaAngularVelocity).m_floats[2];
    fVar41 = ((bodyB->m_angularVelocity).m_floats[0] + (bodyB->m_deltaAngularVelocity).m_floats[0])
             - ((bodyA->m_angularVelocity).m_floats[0] + fVar42);
    fVar51 = ((bodyB->m_angularVelocity).m_floats[1] + (bodyB->m_deltaAngularVelocity).m_floats[1])
             - (fVar38 + (bodyA->m_angularVelocity).m_floats[1]);
    fVar47 = ((bodyB->m_angularVelocity).m_floats[2] + (bodyB->m_deltaAngularVelocity).m_floats[2])
             - ((bodyA->m_angularVelocity).m_floats[2] + fVar50);
    fVar45 = fVar47 * fVar47 + fVar41 * fVar41 + fVar51 * fVar51;
    if (fVar45 <= 1.1920929e-07) goto LAB_0018ad7c;
    fVar27 = 1.0 / SQRT(fVar45);
    fVar40 = fVar41 * fVar27;
    fVar31 = fVar51 * fVar27;
    fVar27 = fVar27 * fVar47;
    fVar45 = *(float *)&(pbVar15->super_btCollisionObject).field_0x14c;
    fVar36 = *(float *)&pbVar15->field_0x150;
    fVar57 = *(float *)&pbVar15->field_0x15c;
    fVar35 = *(float *)&pbVar15->field_0x160;
    fVar59 = *(float *)&pbVar15->field_0x170;
    fVar33 = *(float *)&pbVar15->field_0x16c;
    fVar23 = *(float *)&pbVar15->field_0x164;
    fVar43 = *(float *)&pbVar15->field_0x154;
    fVar52 = *(float *)&pbVar15->field_0x174;
    fVar27 = this->m_damping *
             (1.0 / ((*(float *)&pbVar16->field_0x174 * fVar27 +
                     *(float *)&pbVar16->field_0x154 * fVar40 +
                     *(float *)&pbVar16->field_0x164 * fVar31) * fVar27 +
                     (*(float *)&pbVar16->field_0x16c * fVar27 +
                     *(float *)&(pbVar16->super_btCollisionObject).field_0x14c * fVar40 +
                     *(float *)&pbVar16->field_0x15c * fVar31) * fVar40 +
                     (*(float *)&pbVar16->field_0x170 * fVar27 +
                     *(float *)&pbVar16->field_0x150 * fVar40 +
                     *(float *)&pbVar16->field_0x160 * fVar31) * fVar31 +
                    (fVar52 * fVar27 + fVar43 * fVar40 + fVar31 * fVar23) * fVar27 +
                    (fVar33 * fVar27 + fVar45 * fVar40 + fVar31 * fVar57) * fVar40 +
                    (fVar59 * fVar27 + fVar36 * fVar40 + fVar31 * fVar35) * fVar31));
    fVar41 = fVar41 * fVar27;
    fVar51 = fVar51 * fVar27;
    fVar27 = fVar27 * fVar47;
    fVar40 = SQRT(fVar27 * fVar27 + fVar41 * fVar41 + fVar51 * fVar51);
    fVar47 = 1.0 / fVar40;
    fVar41 = fVar41 * fVar47;
    fVar51 = fVar51 * fVar47;
    fVar47 = fVar47 * fVar27;
    if (bodyA->m_originalBody != (btRigidBody *)0x0) {
      fVar31 = fVar40 * 0.0;
      fVar27 = (bodyA->m_linearFactor).m_floats[2];
      uVar11 = *(undefined8 *)(bodyA->m_linearFactor).m_floats;
      uVar12 = *(undefined8 *)(bodyA->m_deltaLinearVelocity).m_floats;
      uVar13 = *(undefined8 *)(bodyA->m_angularFactor).m_floats;
      *(ulong *)(bodyA->m_deltaLinearVelocity).m_floats =
           CONCAT44(fVar31 * (float)((ulong)uVar11 >> 0x20) + (float)((ulong)uVar12 >> 0x20),
                    fVar31 * (float)uVar11 + (float)uVar12);
      (bodyA->m_deltaLinearVelocity).m_floats[2] =
           fVar27 * fVar31 + (bodyA->m_deltaLinearVelocity).m_floats[2];
      fVar27 = (bodyA->m_angularFactor).m_floats[2];
      *(ulong *)(bodyA->m_deltaAngularVelocity).m_floats =
           CONCAT44(fVar38 + fVar40 * (float)((ulong)uVar13 >> 0x20) *
                             (fVar47 * fVar23 + fVar41 * fVar57 + fVar35 * fVar51),
                    fVar42 + fVar40 * (float)uVar13 *
                             (fVar47 * fVar43 + fVar41 * fVar45 + fVar36 * fVar51));
      (bodyA->m_deltaAngularVelocity).m_floats[2] =
           fVar50 + fVar27 * fVar40 * (fVar52 * fVar47 + fVar33 * fVar41 + fVar59 * fVar51);
    }
    if (bodyB->m_originalBody == (btRigidBody *)0x0) goto LAB_0018ad7c;
    fVar50 = *(float *)&pbVar16->field_0x170;
    fVar45 = *(float *)&pbVar16->field_0x16c;
    fVar42 = *(float *)&pbVar16->field_0x174;
    fVar43 = fVar40 * -0.0;
    fVar38 = (bodyB->m_linearFactor).m_floats[2];
    uVar11 = *(undefined8 *)(bodyB->m_deltaLinearVelocity).m_floats;
    uVar12 = *(undefined8 *)(bodyB->m_deltaAngularVelocity).m_floats;
    uVar13 = *(undefined8 *)(bodyB->m_angularFactor).m_floats;
    uVar14 = *(undefined8 *)(bodyB->m_linearFactor).m_floats;
    fVar36 = *(float *)&pbVar16->field_0x160;
    fVar57 = *(float *)&(pbVar16->super_btCollisionObject).field_0x14c;
    fVar35 = *(float *)&pbVar16->field_0x150;
    fVar59 = *(float *)&pbVar16->field_0x154;
    fVar33 = *(float *)&pbVar16->field_0x15c;
    fVar23 = *(float *)&pbVar16->field_0x164;
    *(ulong *)(bodyB->m_deltaLinearVelocity).m_floats =
         CONCAT44(fVar43 * (float)((ulong)uVar14 >> 0x20) + (float)((ulong)uVar11 >> 0x20),
                  fVar43 * (float)uVar14 + (float)uVar11);
    (bodyB->m_deltaLinearVelocity).m_floats[2] =
         fVar38 * fVar43 + (bodyB->m_deltaLinearVelocity).m_floats[2];
    fVar38 = (bodyB->m_angularFactor).m_floats[2];
    *(ulong *)(bodyB->m_deltaAngularVelocity).m_floats =
         CONCAT44((float)((ulong)uVar12 >> 0x20) -
                  fVar40 * (float)((ulong)uVar13 >> 0x20) *
                  (fVar47 * fVar23 + fVar41 * fVar33 + fVar51 * fVar36),
                  (float)uVar12 -
                  fVar40 * (float)uVar13 * (fVar47 * fVar59 + fVar41 * fVar57 + fVar51 * fVar35));
    bVar24 = (bodyB->m_deltaAngularVelocity).m_floats[2] -
             fVar38 * fVar40 * (fVar42 * fVar47 + fVar45 * fVar41 + fVar50 * fVar51);
  }
  (bodyB->m_deltaAngularVelocity).m_floats[2] = bVar24;
LAB_0018ad7c:
  fVar45 = (bodyA->m_angularVelocity).m_floats[0] + (bodyA->m_deltaAngularVelocity).m_floats[0];
  fVar51 = (bodyA->m_angularVelocity).m_floats[1] + (bodyA->m_deltaAngularVelocity).m_floats[1];
  fVar38 = (bodyA->m_angularVelocity).m_floats[2] + (bodyA->m_deltaAngularVelocity).m_floats[2];
  fVar41 = (bodyB->m_angularVelocity).m_floats[0] + (bodyB->m_deltaAngularVelocity).m_floats[0];
  fVar42 = (bodyB->m_angularVelocity).m_floats[1] + (bodyB->m_deltaAngularVelocity).m_floats[1];
  fVar50 = (bodyB->m_angularVelocity).m_floats[2] + (bodyB->m_deltaAngularVelocity).m_floats[2];
  if (this->m_solveSwingLimit == true) {
    fVar59 = (this->m_swingCorrection * this->m_swingLimitRatio * this->m_biasFactor) / timeStep;
    fVar47 = (this->m_swingAxis).m_floats[0];
    fVar36 = (this->m_swingAxis).m_floats[1];
    fVar57 = (this->m_swingAxis).m_floats[2];
    fVar33 = (fVar50 - fVar38) * fVar57 + (fVar41 - fVar45) * fVar47 + (fVar42 - fVar51) * fVar36;
    uVar20 = -(uint)(0.0 < fVar33);
    fVar35 = this->m_accSwingLimitImpulse;
    fVar59 = (float)(~uVar20 & (uint)fVar59 |
                    (uint)(this->m_swingLimitRatio * fVar33 * this->m_relaxationFactor + fVar59) &
                    uVar20) * this->m_kSwing + fVar35;
    if (fVar59 <= 0.0) {
      fVar59 = 0.0;
    }
    this->m_accSwingLimitImpulse = fVar59;
    fVar59 = fVar59 - fVar35;
    fVar47 = fVar47 * fVar59;
    fVar36 = fVar36 * fVar59;
    fVar59 = fVar59 * fVar57;
    fVar57 = (this->m_twistAxisA).m_floats[0];
    fVar35 = (this->m_twistAxisA).m_floats[1];
    fVar33 = (this->m_twistAxisA).m_floats[2];
    fVar23 = fVar59 * fVar33 + fVar47 * fVar57 + fVar35 * fVar36;
    fVar47 = fVar47 - fVar57 * fVar23;
    fVar36 = fVar36 - fVar35 * fVar23;
    fVar59 = fVar59 - fVar23 * fVar33;
    fVar57 = SQRT(fVar59 * fVar59 + fVar47 * fVar47 + fVar36 * fVar36);
    fVar35 = 1.0 / fVar57;
    fVar47 = fVar47 * fVar35;
    fVar36 = fVar36 * fVar35;
    fVar35 = fVar35 * fVar59;
    if (bodyA->m_originalBody != (btRigidBody *)0x0) {
      pbVar15 = (this->super_btTypedConstraint).m_rbA;
      fVar59 = *(float *)&pbVar15->field_0x170;
      fVar33 = *(float *)&pbVar15->field_0x16c;
      fVar23 = *(float *)&pbVar15->field_0x174;
      fVar26 = fVar57 * 0.0;
      fVar43 = (bodyA->m_linearFactor).m_floats[2];
      uVar11 = *(undefined8 *)(bodyA->m_deltaLinearVelocity).m_floats;
      uVar12 = *(undefined8 *)(bodyA->m_deltaAngularVelocity).m_floats;
      uVar13 = *(undefined8 *)(bodyA->m_angularFactor).m_floats;
      uVar14 = *(undefined8 *)(bodyA->m_linearFactor).m_floats;
      fVar52 = *(float *)&pbVar15->field_0x160;
      fVar27 = *(float *)&(pbVar15->super_btCollisionObject).field_0x14c;
      fVar40 = *(float *)&pbVar15->field_0x150;
      fVar31 = *(float *)&pbVar15->field_0x154;
      fVar21 = *(float *)&pbVar15->field_0x15c;
      fVar25 = *(float *)&pbVar15->field_0x164;
      *(ulong *)(bodyA->m_deltaLinearVelocity).m_floats =
           CONCAT44(fVar26 * (float)((ulong)uVar14 >> 0x20) + (float)((ulong)uVar11 >> 0x20),
                    fVar26 * (float)uVar14 + (float)uVar11);
      (bodyA->m_deltaLinearVelocity).m_floats[2] =
           fVar43 * fVar26 + (bodyA->m_deltaLinearVelocity).m_floats[2];
      fVar43 = (bodyA->m_angularFactor).m_floats[2];
      local_428 = (float)uVar13;
      fStack_424 = (float)((ulong)uVar13 >> 0x20);
      local_418 = (float)uVar12;
      fStack_414 = (float)((ulong)uVar12 >> 0x20);
      *(ulong *)(bodyA->m_deltaAngularVelocity).m_floats =
           CONCAT44(fVar57 * fStack_424 * (fVar35 * fVar25 + fVar47 * fVar21 + fVar36 * fVar52) +
                    fStack_414,
                    fVar57 * local_428 * (fVar35 * fVar31 + fVar47 * fVar27 + fVar36 * fVar40) +
                    local_418);
      (bodyA->m_deltaAngularVelocity).m_floats[2] =
           fVar43 * fVar57 * (fVar23 * fVar35 + fVar33 * fVar47 + fVar59 * fVar36) +
           (bodyA->m_deltaAngularVelocity).m_floats[2];
    }
    if (bodyB->m_originalBody != (btRigidBody *)0x0) {
      pbVar15 = (this->super_btTypedConstraint).m_rbB;
      fVar59 = *(float *)&pbVar15->field_0x170;
      fVar33 = *(float *)&pbVar15->field_0x16c;
      fVar23 = *(float *)&pbVar15->field_0x174;
      fVar26 = fVar57 * -0.0;
      fVar43 = (bodyB->m_linearFactor).m_floats[2];
      uVar11 = *(undefined8 *)(bodyB->m_deltaLinearVelocity).m_floats;
      uVar12 = *(undefined8 *)(bodyB->m_deltaAngularVelocity).m_floats;
      uVar13 = *(undefined8 *)(bodyB->m_angularFactor).m_floats;
      uVar14 = *(undefined8 *)(bodyB->m_linearFactor).m_floats;
      fVar52 = *(float *)&pbVar15->field_0x160;
      fVar27 = *(float *)&(pbVar15->super_btCollisionObject).field_0x14c;
      fVar40 = *(float *)&pbVar15->field_0x150;
      fVar31 = *(float *)&pbVar15->field_0x154;
      fVar21 = *(float *)&pbVar15->field_0x15c;
      fVar25 = *(float *)&pbVar15->field_0x164;
      *(ulong *)(bodyB->m_deltaLinearVelocity).m_floats =
           CONCAT44(fVar26 * (float)((ulong)uVar14 >> 0x20) + (float)((ulong)uVar11 >> 0x20),
                    fVar26 * (float)uVar14 + (float)uVar11);
      (bodyB->m_deltaLinearVelocity).m_floats[2] =
           fVar43 * fVar26 + (bodyB->m_deltaLinearVelocity).m_floats[2];
      fVar43 = (bodyB->m_angularFactor).m_floats[2];
      local_428 = (float)uVar13;
      fStack_424 = (float)((ulong)uVar13 >> 0x20);
      *(ulong *)(bodyB->m_deltaAngularVelocity).m_floats =
           CONCAT44((float)((ulong)uVar12 >> 0x20) -
                    fVar57 * fStack_424 * (fVar35 * fVar25 + fVar47 * fVar21 + fVar36 * fVar52),
                    (float)uVar12 -
                    fVar57 * local_428 * (fVar35 * fVar31 + fVar47 * fVar27 + fVar36 * fVar40));
      (bodyB->m_deltaAngularVelocity).m_floats[2] =
           (bodyB->m_deltaAngularVelocity).m_floats[2] -
           fVar43 * fVar57 * (fVar23 * fVar35 + fVar33 * fVar47 + fVar59 * fVar36);
    }
  }
  if (this->m_solveTwistLimit == true) {
    fVar35 = (this->m_twistCorrection * this->m_twistLimitRatio * this->m_biasFactor) / timeStep;
    fVar47 = (this->m_twistAxis).m_floats[0];
    fVar36 = (this->m_twistAxis).m_floats[1];
    fVar57 = (this->m_twistAxis).m_floats[2];
    fVar41 = (fVar50 - fVar38) * fVar57 + (fVar41 - fVar45) * fVar47 + (fVar42 - fVar51) * fVar36;
    uVar20 = -(uint)(0.0 < fVar41);
    fVar50 = this->m_accTwistLimitImpulse;
    fVar41 = (float)(~uVar20 & (uint)fVar35 |
                    (uint)(this->m_twistLimitRatio * fVar41 * this->m_relaxationFactor + fVar35) &
                    uVar20) * this->m_kTwist + fVar50;
    if (fVar41 <= 0.0) {
      fVar41 = 0.0;
    }
    this->m_accTwistLimitImpulse = fVar41;
    fVar41 = fVar41 - fVar50;
    if (bodyA->m_originalBody != (btRigidBody *)0x0) {
      pbVar15 = (this->super_btTypedConstraint).m_rbA;
      fVar50 = *(float *)&pbVar15->field_0x170;
      fVar51 = *(float *)&pbVar15->field_0x16c;
      fVar45 = *(float *)&pbVar15->field_0x174;
      fVar52 = fVar41 * 0.0;
      fVar42 = (bodyA->m_linearFactor).m_floats[2];
      uVar11 = *(undefined8 *)(bodyA->m_deltaLinearVelocity).m_floats;
      uVar12 = *(undefined8 *)(bodyA->m_deltaAngularVelocity).m_floats;
      uVar13 = *(undefined8 *)(bodyA->m_angularFactor).m_floats;
      uVar14 = *(undefined8 *)(bodyA->m_linearFactor).m_floats;
      fVar38 = *(float *)&pbVar15->field_0x160;
      fVar35 = *(float *)&(pbVar15->super_btCollisionObject).field_0x14c;
      fVar59 = *(float *)&pbVar15->field_0x150;
      fVar33 = *(float *)&pbVar15->field_0x154;
      fVar23 = *(float *)&pbVar15->field_0x15c;
      fVar43 = *(float *)&pbVar15->field_0x164;
      *(ulong *)(bodyA->m_deltaLinearVelocity).m_floats =
           CONCAT44(fVar52 * (float)((ulong)uVar14 >> 0x20) + (float)((ulong)uVar11 >> 0x20),
                    fVar52 * (float)uVar14 + (float)uVar11);
      (bodyA->m_deltaLinearVelocity).m_floats[2] =
           fVar42 * fVar52 + (bodyA->m_deltaLinearVelocity).m_floats[2];
      fVar42 = (bodyA->m_angularFactor).m_floats[2];
      *(ulong *)(bodyA->m_deltaAngularVelocity).m_floats =
           CONCAT44(fVar41 * (float)((ulong)uVar13 >> 0x20) *
                    (fVar57 * fVar43 + fVar47 * fVar23 + fVar36 * fVar38) +
                    (float)((ulong)uVar12 >> 0x20),
                    fVar41 * (float)uVar13 * (fVar57 * fVar33 + fVar47 * fVar35 + fVar36 * fVar59) +
                    (float)uVar12);
      (bodyA->m_deltaAngularVelocity).m_floats[2] =
           fVar42 * fVar41 * (fVar45 * fVar57 + fVar51 * fVar47 + fVar50 * fVar36) +
           (bodyA->m_deltaAngularVelocity).m_floats[2];
    }
    if (bodyB->m_originalBody != (btRigidBody *)0x0) {
      pbVar15 = (this->super_btTypedConstraint).m_rbB;
      fVar50 = (this->m_twistAxis).m_floats[2];
      fVar51 = (this->m_twistAxis).m_floats[0];
      fVar45 = (this->m_twistAxis).m_floats[1];
      fVar42 = *(float *)&pbVar15->field_0x170;
      fVar38 = *(float *)&pbVar15->field_0x16c;
      fVar47 = *(float *)&pbVar15->field_0x174;
      fVar52 = fVar41 * -0.0;
      fVar36 = (bodyB->m_linearFactor).m_floats[2];
      uVar11 = *(undefined8 *)(bodyB->m_deltaLinearVelocity).m_floats;
      uVar12 = *(undefined8 *)(bodyB->m_linearFactor).m_floats;
      fVar57 = *(float *)&pbVar15->field_0x160;
      fVar35 = *(float *)&(pbVar15->super_btCollisionObject).field_0x14c;
      fVar59 = *(float *)&pbVar15->field_0x150;
      fVar33 = *(float *)&pbVar15->field_0x154;
      fVar23 = *(float *)&pbVar15->field_0x15c;
      fVar43 = *(float *)&pbVar15->field_0x164;
      *(ulong *)(bodyB->m_deltaLinearVelocity).m_floats =
           CONCAT44(fVar52 * (float)((ulong)uVar12 >> 0x20) + (float)((ulong)uVar11 >> 0x20),
                    fVar52 * (float)uVar12 + (float)uVar11);
      (bodyB->m_deltaLinearVelocity).m_floats[2] =
           fVar36 * fVar52 + (bodyB->m_deltaLinearVelocity).m_floats[2];
      fVar36 = (bodyB->m_angularFactor).m_floats[2];
      uVar11 = *(undefined8 *)(bodyB->m_deltaAngularVelocity).m_floats;
      uVar12 = *(undefined8 *)(bodyB->m_angularFactor).m_floats;
      *(ulong *)(bodyB->m_deltaAngularVelocity).m_floats =
           CONCAT44((float)((ulong)uVar11 >> 0x20) -
                    fVar41 * (float)((ulong)uVar12 >> 0x20) *
                    (fVar50 * fVar43 + fVar51 * fVar23 + fVar45 * fVar57),
                    (float)uVar11 -
                    fVar41 * (float)uVar12 * (fVar50 * fVar33 + fVar51 * fVar35 + fVar45 * fVar59));
      (bodyB->m_deltaAngularVelocity).m_floats[2] =
           (bodyB->m_deltaAngularVelocity).m_floats[2] -
           fVar36 * fVar41 * (fVar47 * fVar50 + fVar38 * fVar51 + fVar42 * fVar45);
    }
  }
  return;
}

Assistant:

void	btConeTwistConstraint::solveConstraintObsolete(btSolverBody& bodyA,btSolverBody& bodyB,btScalar	timeStep)
{
	#ifndef __SPU__
	if (m_useSolveConstraintObsolete)
	{
		btVector3 pivotAInW = m_rbA.getCenterOfMassTransform()*m_rbAFrame.getOrigin();
		btVector3 pivotBInW = m_rbB.getCenterOfMassTransform()*m_rbBFrame.getOrigin();

		btScalar tau = btScalar(0.3);

		//linear part
		if (!m_angularOnly)
		{
			btVector3 rel_pos1 = pivotAInW - m_rbA.getCenterOfMassPosition(); 
			btVector3 rel_pos2 = pivotBInW - m_rbB.getCenterOfMassPosition();

			btVector3 vel1;
			bodyA.internalGetVelocityInLocalPointObsolete(rel_pos1,vel1);
			btVector3 vel2;
			bodyB.internalGetVelocityInLocalPointObsolete(rel_pos2,vel2);
			btVector3 vel = vel1 - vel2;

			for (int i=0;i<3;i++)
			{		
				const btVector3& normal = m_jac[i].m_linearJointAxis;
				btScalar jacDiagABInv = btScalar(1.) / m_jac[i].getDiagonal();

				btScalar rel_vel;
				rel_vel = normal.dot(vel);
				//positional error (zeroth order error)
				btScalar depth = -(pivotAInW - pivotBInW).dot(normal); //this is the error projected on the normal
				btScalar impulse = depth*tau/timeStep  * jacDiagABInv -  rel_vel * jacDiagABInv;
				m_appliedImpulse += impulse;
				
				btVector3 ftorqueAxis1 = rel_pos1.cross(normal);
				btVector3 ftorqueAxis2 = rel_pos2.cross(normal);
				bodyA.internalApplyImpulse(normal*m_rbA.getInvMass(), m_rbA.getInvInertiaTensorWorld()*ftorqueAxis1,impulse);
				bodyB.internalApplyImpulse(normal*m_rbB.getInvMass(), m_rbB.getInvInertiaTensorWorld()*ftorqueAxis2,-impulse);
		
			}
		}

		// apply motor
		if (m_bMotorEnabled)
		{
			// compute current and predicted transforms
			btTransform trACur = m_rbA.getCenterOfMassTransform();
			btTransform trBCur = m_rbB.getCenterOfMassTransform();
			btVector3 omegaA; bodyA.internalGetAngularVelocity(omegaA);
			btVector3 omegaB; bodyB.internalGetAngularVelocity(omegaB);
			btTransform trAPred; trAPred.setIdentity(); 
			btVector3 zerovec(0,0,0);
			btTransformUtil::integrateTransform(
				trACur, zerovec, omegaA, timeStep, trAPred);
			btTransform trBPred; trBPred.setIdentity(); 
			btTransformUtil::integrateTransform(
				trBCur, zerovec, omegaB, timeStep, trBPred);

			// compute desired transforms in world
			btTransform trPose(m_qTarget);
			btTransform trABDes = m_rbBFrame * trPose * m_rbAFrame.inverse();
			btTransform trADes = trBPred * trABDes;
			btTransform trBDes = trAPred * trABDes.inverse();

			// compute desired omegas in world
			btVector3 omegaADes, omegaBDes;
			
			btTransformUtil::calculateVelocity(trACur, trADes, timeStep, zerovec, omegaADes);
			btTransformUtil::calculateVelocity(trBCur, trBDes, timeStep, zerovec, omegaBDes);

			// compute delta omegas
			btVector3 dOmegaA = omegaADes - omegaA;
			btVector3 dOmegaB = omegaBDes - omegaB;

			// compute weighted avg axis of dOmega (weighting based on inertias)
			btVector3 axisA, axisB;
			btScalar kAxisAInv = 0, kAxisBInv = 0;

			if (dOmegaA.length2() > SIMD_EPSILON)
			{
				axisA = dOmegaA.normalized();
				kAxisAInv = getRigidBodyA().computeAngularImpulseDenominator(axisA);
			}

			if (dOmegaB.length2() > SIMD_EPSILON)
			{
				axisB = dOmegaB.normalized();
				kAxisBInv = getRigidBodyB().computeAngularImpulseDenominator(axisB);
			}

			btVector3 avgAxis = kAxisAInv * axisA + kAxisBInv * axisB;

			static bool bDoTorque = true;
			if (bDoTorque && avgAxis.length2() > SIMD_EPSILON)
			{
				avgAxis.normalize();
				kAxisAInv = getRigidBodyA().computeAngularImpulseDenominator(avgAxis);
				kAxisBInv = getRigidBodyB().computeAngularImpulseDenominator(avgAxis);
				btScalar kInvCombined = kAxisAInv + kAxisBInv;

				btVector3 impulse = (kAxisAInv * dOmegaA - kAxisBInv * dOmegaB) /
									(kInvCombined * kInvCombined);

				if (m_maxMotorImpulse >= 0)
				{
					btScalar fMaxImpulse = m_maxMotorImpulse;
					if (m_bNormalizedMotorStrength)
						fMaxImpulse = fMaxImpulse/kAxisAInv;

					btVector3 newUnclampedAccImpulse = m_accMotorImpulse + impulse;
					btScalar  newUnclampedMag = newUnclampedAccImpulse.length();
					if (newUnclampedMag > fMaxImpulse)
					{
						newUnclampedAccImpulse.normalize();
						newUnclampedAccImpulse *= fMaxImpulse;
						impulse = newUnclampedAccImpulse - m_accMotorImpulse;
					}
					m_accMotorImpulse += impulse;
				}

				btScalar  impulseMag  = impulse.length();
				btVector3 impulseAxis =  impulse / impulseMag;

				bodyA.internalApplyImpulse(btVector3(0,0,0), m_rbA.getInvInertiaTensorWorld()*impulseAxis, impulseMag);
				bodyB.internalApplyImpulse(btVector3(0,0,0), m_rbB.getInvInertiaTensorWorld()*impulseAxis, -impulseMag);

			}
		}
		else if (m_damping > SIMD_EPSILON) // no motor: do a little damping
		{
			btVector3 angVelA; bodyA.internalGetAngularVelocity(angVelA);
			btVector3 angVelB; bodyB.internalGetAngularVelocity(angVelB);
			btVector3 relVel = angVelB - angVelA;
			if (relVel.length2() > SIMD_EPSILON)
			{
				btVector3 relVelAxis = relVel.normalized();
				btScalar m_kDamping =  btScalar(1.) /
					(getRigidBodyA().computeAngularImpulseDenominator(relVelAxis) +
					 getRigidBodyB().computeAngularImpulseDenominator(relVelAxis));
				btVector3 impulse = m_damping * m_kDamping * relVel;

				btScalar  impulseMag  = impulse.length();
				btVector3 impulseAxis = impulse / impulseMag;
				bodyA.internalApplyImpulse(btVector3(0,0,0), m_rbA.getInvInertiaTensorWorld()*impulseAxis, impulseMag);
				bodyB.internalApplyImpulse(btVector3(0,0,0), m_rbB.getInvInertiaTensorWorld()*impulseAxis, -impulseMag);
			}
		}

		// joint limits
		{
			///solve angular part
			btVector3 angVelA;
			bodyA.internalGetAngularVelocity(angVelA);
			btVector3 angVelB;
			bodyB.internalGetAngularVelocity(angVelB);

			// solve swing limit
			if (m_solveSwingLimit)
			{
				btScalar amplitude = m_swingLimitRatio * m_swingCorrection*m_biasFactor/timeStep;
				btScalar relSwingVel = (angVelB - angVelA).dot(m_swingAxis);
				if (relSwingVel > 0)
					amplitude += m_swingLimitRatio * relSwingVel * m_relaxationFactor;
				btScalar impulseMag = amplitude * m_kSwing;

				// Clamp the accumulated impulse
				btScalar temp = m_accSwingLimitImpulse;
				m_accSwingLimitImpulse = btMax(m_accSwingLimitImpulse + impulseMag, btScalar(0.0) );
				impulseMag = m_accSwingLimitImpulse - temp;

				btVector3 impulse = m_swingAxis * impulseMag;

				// don't let cone response affect twist
				// (this can happen since body A's twist doesn't match body B's AND we use an elliptical cone limit)
				{
					btVector3 impulseTwistCouple = impulse.dot(m_twistAxisA) * m_twistAxisA;
					btVector3 impulseNoTwistCouple = impulse - impulseTwistCouple;
					impulse = impulseNoTwistCouple;
				}

				impulseMag = impulse.length();
				btVector3 noTwistSwingAxis = impulse / impulseMag;

				bodyA.internalApplyImpulse(btVector3(0,0,0), m_rbA.getInvInertiaTensorWorld()*noTwistSwingAxis, impulseMag);
				bodyB.internalApplyImpulse(btVector3(0,0,0), m_rbB.getInvInertiaTensorWorld()*noTwistSwingAxis, -impulseMag);
			}


			// solve twist limit
			if (m_solveTwistLimit)
			{
				btScalar amplitude = m_twistLimitRatio * m_twistCorrection*m_biasFactor/timeStep;
				btScalar relTwistVel = (angVelB - angVelA).dot( m_twistAxis );
				if (relTwistVel > 0) // only damp when moving towards limit (m_twistAxis flipping is important)
					amplitude += m_twistLimitRatio * relTwistVel * m_relaxationFactor;
				btScalar impulseMag = amplitude * m_kTwist;

				// Clamp the accumulated impulse
				btScalar temp = m_accTwistLimitImpulse;
				m_accTwistLimitImpulse = btMax(m_accTwistLimitImpulse + impulseMag, btScalar(0.0) );
				impulseMag = m_accTwistLimitImpulse - temp;

		//		btVector3 impulse = m_twistAxis * impulseMag;

				bodyA.internalApplyImpulse(btVector3(0,0,0), m_rbA.getInvInertiaTensorWorld()*m_twistAxis,impulseMag);
				bodyB.internalApplyImpulse(btVector3(0,0,0), m_rbB.getInvInertiaTensorWorld()*m_twistAxis,-impulseMag);
			}		
		}
	}
#else
btAssert(0);
#endif //__SPU__
}